

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O0

size_t __thiscall
trieste::wf::Choice::expected_distance_to_terminal
          (Choice *this,
          set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *omit,
          size_t max_distance,function<unsigned_long_(trieste::Token)> *distance)

{
  anon_class_24_3_b22afc75 __binary_op;
  const_iterator __first;
  const_iterator __last;
  unsigned_long uVar1;
  size_type sVar2;
  function<unsigned_long_(trieste::Token)> *distance_local;
  size_t max_distance_local;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *omit_local;
  Choice *this_local;
  
  distance_local = (function<unsigned_long_(trieste::Token)> *)max_distance;
  max_distance_local = (size_t)omit;
  omit_local = (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
               this;
  __first = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::begin(&this->types);
  __last = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::end(&this->types);
  __binary_op.max_distance = (size_t *)&distance_local;
  __binary_op.omit =
       (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
       max_distance_local;
  __binary_op.distance = distance;
  uVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<trieste::Token_const*,std::vector<trieste::Token,std::allocator<trieste::Token>>>,unsigned_long,trieste::wf::Choice::expected_distance_to_terminal(std::set<trieste::Token,std::less<trieste::Token>,std::allocator<trieste::Token>>const&,unsigned_long,std::function<unsigned_long(trieste::Token)>)const::_lambda(unsigned_long,auto:1&)_1_>
                    ((__normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
                      )__last._M_current,0,__binary_op);
  sVar2 = std::vector<trieste::Token,_std::allocator<trieste::Token>_>::size(&this->types);
  return uVar1 / sVar2;
}

Assistant:

std::size_t expected_distance_to_terminal(
        const std::set<Token>& omit,
        std::size_t max_distance,
        std::function<std::size_t(Token)> distance) const
      {
        return std::accumulate(
                 types.begin(),
                 types.end(),
                 static_cast<std::size_t>(0),
                 [&](std::size_t acc, auto& type) {
                   if (omit.find(type) != omit.end())
                   {
                     return acc + max_distance;
                   }

                   return acc + distance(type);
                 }) /
          types.size();
      }